

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_set_register_tests.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::pixie::
SubjectSetRegisterTest_next_subscription_sync_returns_an_uncompressed_message_that_we_can_compress_later_Test
::TestBody(SubjectSetRegisterTest_next_subscription_sync_returns_an_uncompressed_message_that_we_can_compress_later_Test
           *this)

{
  bool bVar1;
  byte bVar2;
  char *pcVar3;
  char *in_R9;
  AssertHelper local_1a8;
  Message local_1a0;
  bool local_192;
  bool local_191;
  undefined1 local_190 [8];
  AssertionResult gtest_ar;
  string local_178;
  AssertHelper local_158;
  Message local_150;
  undefined1 local_148 [8];
  AssertionResult gtest_ar_;
  optional<bidfx_public_api::price::pixie::SubscriptionSync> message;
  Subject local_b8 [24];
  SubjectSetRegister local_a0 [8];
  SubjectSetRegister subject_register;
  SubjectSetRegisterTest_next_subscription_sync_returns_an_uncompressed_message_that_we_can_compress_later_Test
  *this_local;
  
  bidfx_public_api::price::pixie::SubjectSetRegister::SubjectSetRegister(local_a0);
  bidfx_public_api::price::subject::Subject::Subject(local_b8,(Subject *)SS_SUBJECT0);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register(local_a0,local_b8,0);
  subject::Subject::~Subject(local_b8);
  bidfx_public_api::price::pixie::SubjectSetRegister::NextSubscriptionSync();
  testing::AssertionResult::
  AssertionResult<std::optional<bidfx_public_api::price::pixie::SubscriptionSync>>
            ((AssertionResult *)local_148,
             (optional<bidfx_public_api::price::pixie::SubscriptionSync> *)&gtest_ar_.message_,
             (type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
  if (!bVar1) {
    testing::Message::Message(&local_150);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_178,(internal *)local_148,(AssertionResult *)0x3280be,"false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_158,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
               ,0xa6,pcVar3);
    testing::internal::AssertHelper::operator=(&local_158,&local_150);
    testing::internal::AssertHelper::~AssertHelper(&local_158);
    std::__cxx11::string::~string((string *)&local_178);
    testing::Message::~Message(&local_150);
  }
  gtest_ar.message_.ptr_._5_3_ = 0;
  gtest_ar.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
  if (gtest_ar.message_.ptr_._4_4_ == 0) {
    local_191 = false;
    std::optional<bidfx_public_api::price::pixie::SubscriptionSync>::operator->
              ((optional<bidfx_public_api::price::pixie::SubscriptionSync> *)&gtest_ar_.message_);
    bVar2 = bidfx_public_api::price::pixie::SubscriptionSync::IsCompressed();
    local_192 = (bool)(bVar2 & 1);
    testing::internal::EqHelper<false>::Compare<bool,bool>
              ((EqHelper<false> *)local_190,"false","message->IsCompressed()",&local_191,&local_192)
    ;
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_190);
    if (!bVar1) {
      testing::Message::Message(&local_1a0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_190);
      testing::internal::AssertHelper::AssertHelper
                (&local_1a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
                 ,0xa7,pcVar3);
      testing::internal::AssertHelper::operator=(&local_1a8,&local_1a0);
      testing::internal::AssertHelper::~AssertHelper(&local_1a8);
      testing::Message::~Message(&local_1a0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_190);
    gtest_ar.message_.ptr_._4_4_ = 0;
  }
  std::optional<bidfx_public_api::price::pixie::SubscriptionSync>::~optional
            ((optional<bidfx_public_api::price::pixie::SubscriptionSync> *)&gtest_ar_.message_);
  SubjectSetRegister::~SubjectSetRegister(local_a0);
  return;
}

Assistant:

TEST(SubjectSetRegisterTest, next_subscription_sync_returns_an_uncompressed_message_that_we_can_compress_later)
{
    SubjectSetRegister subject_register = SubjectSetRegister();
    subject_register.Register(SS_SUBJECT0, false);
    std::optional<SubscriptionSync> message = subject_register.NextSubscriptionSync();
    ASSERT_TRUE(message);
    EXPECT_EQ(false, message->IsCompressed());
}